

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void hash_free_active(hash *hash,hash_free_func *free_func)

{
  avl_node *paVar1;
  code *in_RSI;
  ulong *in_RDI;
  hash_elem *h;
  avl_node *node;
  size_t i;
  avl_node *local_20;
  ulong local_18;
  
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    local_20 = avl_first((avl_tree *)(in_RDI[1] + local_18 * 0x10));
    while (local_20 != (avl_node *)0x0) {
      paVar1 = avl_next(local_20);
      avl_remove((avl_tree *)i,node);
      (*in_RSI)(local_20);
      local_20 = paVar1;
    }
  }
  hash_free((hash *)0x11ae3f);
  return;
}

Assistant:

void hash_free_active(struct hash *hash, hash_free_func *free_func)
{
    size_t i;

#ifdef _HASH_TREE
    struct avl_node *node;
#else
    struct list_elem *e, *e_next;
#endif

    struct hash_elem *h;

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        node = avl_first(hash->buckets + i);
        while(node){
            h = _get_entry(node, struct hash_elem, avl);
            node = avl_next(node);
            avl_remove(hash->buckets + i, &h->avl);
            free_func(h);
        }

#else
        e = list_begin(hash->buckets + i);
        while(e) {
            e_next = list_remove(hash->buckets + i, e);
            h = _get_entry(e, struct hash_elem, list_elem);
            free_func(h);
            e = e_next;
        }

#endif
    }

    hash_free(hash);
}